

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDPValueIteration.cpp
# Opt level: O0

void __thiscall MDPValueIteration::PlanWithCache(MDPValueIteration *this,bool computeIfNotCached)

{
  ostream *poVar1;
  PlanningUnitDecPOMDPDiscrete *this_00;
  size_t sVar2;
  byte in_SIL;
  MDPSolver *in_RDI;
  string filenameCache;
  stringstream ss;
  allocator<char> *__a;
  allocator<char> *__s;
  PlanningUnit *in_stack_fffffffffffffdf0;
  string *in_stack_fffffffffffffdf8;
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [32];
  stringstream local_198 [16];
  allocator<char> local_188 [383];
  byte local_9;
  
  local_9 = in_SIL & 1;
  std::__cxx11::stringstream::stringstream(local_198);
  __a = local_188;
  __s = &local_1d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf0,(char *)__s,__a);
  MDPSolver::GetPU(in_RDI);
  directories::MADPGetResultsDir(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
  poVar1 = std::operator<<((ostream *)__a,local_1b8);
  std::operator<<(poVar1,"/MDPQtable");
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string(local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  if (((ulong)in_RDI[3]._m_pu & 0x100) != 0) {
    poVar1 = std::operator<<((ostream *)local_188,"_h");
    this_00 = MDPSolver::GetPU(in_RDI);
    sVar2 = PlanningUnit::GetHorizon((PlanningUnit *)this_00);
    std::ostream::operator<<(poVar1,sVar2);
  }
  std::__cxx11::stringstream::str();
  (*in_RDI->_vptr_MDPSolver[4])(in_RDI,&stack0xfffffffffffffdf0,(ulong)(local_9 & 1));
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void MDPValueIteration::PlanWithCache(bool computeIfNotCached)
{
    stringstream ss;
    ss << directories::MADPGetResultsDir("GMAA",GetPU()) << "/MDPQtable";
    if(_m_finiteHorizon)
        ss << "_h" << GetPU()->GetHorizon();
    string filenameCache=ss.str();

    PlanWithCache(filenameCache,computeIfNotCached);
}